

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
common_tokenize(llama_vocab *vocab,string *text,bool add_special,bool parse_special)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  int *piVar5;
  size_type sVar6;
  byte in_CL;
  undefined8 in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  byte in_R8B;
  int check;
  int n_tokens;
  vector<int,_std::allocator<int>_> *result;
  allocator_type *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  
  std::__cxx11::string::length();
  std::allocator<int>::allocator((allocator<int> *)0x330941);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff70,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
             ,in_stack_ffffffffffffff60);
  std::allocator<int>::~allocator((allocator<int> *)0x330964);
  uVar4 = std::__cxx11::string::data();
  uVar1 = std::__cxx11::string::length();
  piVar5 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x33099e);
  sVar6 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
  iVar2 = llama_tokenize(in_RSI,uVar4,uVar1,piVar5,sVar6 & 0xffffffff,in_CL & 1,in_R8B & 1);
  if (iVar2 < 0) {
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_ffffffffffffff70,
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    uVar4 = std::__cxx11::string::data();
    uVar1 = std::__cxx11::string::length();
    piVar5 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x330a59);
    sVar6 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    iVar3 = llama_tokenize(in_RSI,uVar4,uVar1,piVar5,sVar6 & 0xffffffff,in_CL & 1,in_R8B & 1);
    if (iVar3 != -iVar2) {
      uVar4 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
                         ,0x4ea,"GGML_ASSERT(%s) failed","check == -n_tokens");
      std::allocator<int>::~allocator((allocator<int> *)0x330b0c);
      _Unwind_Resume(uVar4);
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_ffffffffffffff70,
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  return in_RDI;
}

Assistant:

std::vector<llama_token> common_tokenize(
    const struct llama_vocab * vocab,
           const std::string & text,
                        bool   add_special,
                        bool   parse_special) {
    // upper limit for the number of tokens
    int n_tokens = text.length() + 2 * add_special;
    std::vector<llama_token> result(n_tokens);
    n_tokens = llama_tokenize(vocab, text.data(), text.length(), result.data(), result.size(), add_special, parse_special);
    if (n_tokens < 0) {
        result.resize(-n_tokens);
        int check = llama_tokenize(vocab, text.data(), text.length(), result.data(), result.size(), add_special, parse_special);
        GGML_ASSERT(check == -n_tokens);
    } else {
        result.resize(n_tokens);
    }
    return result;
}